

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

FSerializer * __thiscall
FSerializer::Array<unsigned_int>(FSerializer *this,char *key,uint *obj,int count,bool fullcompare)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  if (((save_full) || (!fullcompare)) || (this->w == (FWriter *)0x0)) {
LAB_003a5fba:
    bVar1 = BeginArray(this,key);
    if (bVar1) {
      if ((this->r != (FReader *)0x0) && (uVar2 = ArraySize(this), (int)uVar2 < count)) {
        count = uVar2;
      }
      if (0 < count) {
        uVar4 = (ulong)(uint)count;
        do {
          ::Serialize(this,(char *)0x0,obj,(uint32_t *)0x0);
          obj = obj + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      EndArray(this);
    }
  }
  else if (count != 0) {
    lVar3 = 0;
    do {
      if (*(char *)((long)obj + lVar3) != '\0') goto LAB_003a5fba;
      lVar3 = lVar3 + 1;
    } while ((long)count * 4 != lVar3);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && nullcmp(obj, count * sizeof(T)))
		{
			return *this;
		}

		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], (T*)nullptr);
			}
			EndArray();
		}
		return *this;
	}